

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

void update_mxcsr_status_x86_64(CPUX86State *env)

{
  uint uVar1;
  
  uVar1 = env->mxcsr;
  (env->sse_status).float_rounding_mode = (byte)(uVar1 >> 0xd) & 3;
  (env->sse_status).flush_inputs_to_zero = (byte)uVar1 >> 6 & 1;
  (env->fp_status).flush_to_zero = (byte)(uVar1 >> 0xf) & 1;
  return;
}

Assistant:

void update_mxcsr_status(CPUX86State *env)
{
    uint32_t mxcsr = env->mxcsr;
    int rnd_type;

    /* set rounding mode */
    switch (mxcsr & SSE_RC_MASK) {
    default:
    case SSE_RC_NEAR:
        rnd_type = float_round_nearest_even;
        break;
    case SSE_RC_DOWN:
        rnd_type = float_round_down;
        break;
    case SSE_RC_UP:
        rnd_type = float_round_up;
        break;
    case SSE_RC_CHOP:
        rnd_type = float_round_to_zero;
        break;
    }
    set_float_rounding_mode(rnd_type, &env->sse_status);

    /* set denormals are zero */
    set_flush_inputs_to_zero((mxcsr & SSE_DAZ) ? 1 : 0, &env->sse_status);

    /* set flush to zero */
    set_flush_to_zero((mxcsr & SSE_FZ) ? 1 : 0, &env->fp_status);
}